

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O2

void CBinds::ConfigSaveCallback(IConfigManager *pConfigManager,void *pUserData)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  uint j;
  char (*pacVar6) [20];
  int m;
  long lVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  long in_FS_OFFSET;
  char aBind [256];
  char aBuffer [512];
  char local_338 [768];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar9 = (char *)((long)pUserData + 0x29);
  for (lVar8 = 0; lVar8 != 0x1da; lVar8 = lVar8 + 1) {
    pcVar10 = pcVar9;
    for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
      cVar1 = *(char *)((long)pUserData + lVar7 * 0x80 + lVar8 * 0x200 + 0x28);
      if (cVar1 != '\0') {
        pcVar3 = pcVar10;
        for (lVar5 = 0; (cVar1 != '\0' && (lVar5 < 0xff)); lVar5 = lVar5 + 1) {
          if ((cVar1 == '\\') || (cVar1 == '\"')) {
            local_338[lVar5] = '\\';
            lVar5 = lVar5 + 1;
          }
          local_338[lVar5] = cVar1;
          cVar1 = *pcVar3;
          pcVar3 = pcVar3 + 1;
        }
        local_338[lVar5] = '\0';
        uVar2 = (int)lVar7 - 1;
        pcVar3 = "";
        if (uVar2 < 3) {
          pcVar3 = (&PTR_anon_var_dwarf_3bc69_00206a30)[uVar2];
        }
        str_format(local_338 + 0x100,0x200,"bind %s%s \"%s\"",pcVar3,g_aaKeyStrings + lVar8,
                   local_338);
        (*(pConfigManager->super_IInterface)._vptr_IInterface[8])(pConfigManager,local_338 + 0x100);
      }
      pcVar10 = pcVar10 + 0x80;
    }
    pcVar9 = pcVar9 + 0x200;
  }
  for (lVar8 = 0; lVar8 != 0x1d; lVar8 = lVar8 + 1) {
    uVar2 = s_aaDefaultBindKeys[lVar8][0];
    if (*(char *)((long)pUserData +
                 (long)s_aaDefaultBindKeys[lVar8][1] * 0x80 + (long)(int)uVar2 * 0x200 + 0x28) ==
        '\0') {
      uVar4 = s_aaDefaultBindKeys[lVar8][1] - 1;
      pcVar9 = "";
      if (uVar4 < 3) {
        pcVar9 = (&PTR_anon_var_dwarf_3bc69_00206a30)[uVar4];
      }
      pacVar6 = g_aaKeyStrings + (int)uVar2;
      if (0x1ff < uVar2) {
        pacVar6 = g_aaKeyStrings;
      }
      str_format(local_338 + 0x100,0x200,"unbind %s%s",pcVar9,pacVar6);
      (*(pConfigManager->super_IInterface)._vptr_IInterface[8])(pConfigManager,local_338 + 0x100);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CBinds::ConfigSaveCallback(IConfigManager *pConfigManager, void *pUserData)
{
	CBinds *pSelf = (CBinds *)pUserData;

	char aBuffer[512];
	for(int i = 0; i < KEY_LAST; i++)
	{
		for(int m = 0; m < MODIFIER_COUNT; m++)
		{
			if(pSelf->m_aaaKeyBindings[i][m][0] == 0)
				continue;

			// process the string. we need to escape some characters
			char aBind[2*BIND_LENGTH];
			const char *pSrc = pSelf->m_aaaKeyBindings[i][m];
			const char *pEnd = aBind + sizeof(aBind) - 1;
			char *pDst = aBind;
			while(*pSrc && pDst < pEnd)
			{
				if(*pSrc == '"' || *pSrc == '\\') // escape \ and "
					*pDst++ = '\\';
				*pDst++ = *pSrc++;
			}
			*pDst = 0;

			str_format(aBuffer, sizeof(aBuffer), "bind %s%s \"%s\"", GetModifierName(m), pSelf->Input()->KeyName(i), aBind);
			pConfigManager->WriteLine(aBuffer);
		}
	}

	for(unsigned j = 0; j < sizeof(s_aaDefaultBindKeys)/sizeof(int)/2; j++)
	{
		const int Key = s_aaDefaultBindKeys[j][0];
		const int Modifier = s_aaDefaultBindKeys[j][1];
		if(pSelf->m_aaaKeyBindings[Key][Modifier][0] == 0)
		{
			// explicitly unbind keys that were unbound by the user
			str_format(aBuffer, sizeof(aBuffer), "unbind %s%s", GetModifierName(Modifier), pSelf->Input()->KeyName(Key));
			pConfigManager->WriteLine(aBuffer);
		}
	}
}